

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Error FT_GlyphSlot_Own_Bitmap(FT_GlyphSlot slot)

{
  FT_Error FVar1;
  undefined1 local_40 [4];
  FT_Error error;
  FT_Bitmap bitmap;
  FT_GlyphSlot slot_local;
  
  if (((slot != (FT_GlyphSlot)0x0) && (slot->format == FT_GLYPH_FORMAT_BITMAP)) &&
     ((slot->internal->flags & 1) == 0)) {
    bitmap.palette = slot;
    FT_Bitmap_Init((FT_Bitmap *)local_40);
    FVar1 = FT_Bitmap_Copy(*bitmap.palette,(FT_Bitmap *)((long)bitmap.palette + 0x98),
                           (FT_Bitmap *)local_40);
    if (FVar1 != 0) {
      return FVar1;
    }
    memcpy((void *)((long)bitmap.palette + 0x98),local_40,0x28);
    *(uint *)(*(long *)((long)bitmap.palette + 0x128) + 8) =
         *(uint *)(*(long *)((long)bitmap.palette + 0x128) + 8) | 1;
  }
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_GlyphSlot_Own_Bitmap( FT_GlyphSlot  slot )
  {
    if ( slot && slot->format == FT_GLYPH_FORMAT_BITMAP   &&
         !( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
    {
      FT_Bitmap  bitmap;
      FT_Error   error;


      FT_Bitmap_Init( &bitmap );
      error = FT_Bitmap_Copy( slot->library, &slot->bitmap, &bitmap );
      if ( error )
        return error;

      slot->bitmap = bitmap;
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;
    }

    return FT_Err_Ok;
  }